

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

TValue * cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  uint32_t uVar1;
  TValue *pTVar2;
  ulong uVar3;
  GCRef *pGVar4;
  void *pvVar5;
  
  uVar3 = (ulong)L->base[-1].u32.lo;
  pGVar4 = &L->env;
  if (*(char *)(uVar3 + 5) == '\b') {
    pGVar4 = (GCRef *)(uVar3 + 8);
  }
  uVar1 = pGVar4->gcptr32;
  pvVar5 = lj_mem_newgco(L,0x20);
  *(undefined2 *)((long)pvVar5 + 5) = 0x108;
  *(undefined1 *)((long)pvVar5 + 7) = 0;
  *(uint32_t *)((long)pvVar5 + 0x10) = (L->glref).ptr32 + 0xf0;
  *(uint32_t *)((long)pvVar5 + 8) = uVar1;
  *(lua_CFunction *)((long)pvVar5 + 0x18) = func;
  pTVar2 = L->top;
  (pTVar2->u32).lo = (uint32_t)pvVar5;
  (pTVar2->field_2).it = 0xfffffff7;
  if ((ulong)ud >> 0x2f == 0) {
    L->top[1].u64 = (ulong)ud | 0xffff000000000000;
    *(undefined4 *)((long)L->cframe + 0x10) = 1;
    pTVar2 = L->top;
    L->top = pTVar2 + 2;
    return pTVar2 + 1;
  }
  lj_err_msg(L,LJ_ERR_BADLU);
}

Assistant:

static TValue *cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  GCfunc *fn = lj_func_newC(L, 0, getcurrenv(L));
  fn->c.f = func;
  setfuncV(L, L->top, fn);
  setlightudV(L->top+1, checklightudptr(L, ud));
  cframe_nres(L->cframe) = 1+0;  /* Zero results. */
  L->top += 2;
  return L->top-1;  /* Now call the newly allocated C function. */
}